

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int pigpio_start(char *addrStr,char *portStr)

{
  int iVar1;
  uint32_t uVar2;
  size_t sVar3;
  char *pcVar4;
  int *piVar5;
  pthread_t *ppVar6;
  char *in_RSI;
  char *in_RDI;
  int *userdata;
  int pi;
  char *in_stack_00000020;
  char *in_stack_00000028;
  int in_stack_ffffffffffffffe0;
  int local_1c;
  int local_4;
  
  for (local_1c = 0; (local_1c < 0x20 && (gPiInUse[local_1c] != 0)); local_1c = local_1c + 1) {
  }
  if (local_1c < 0x20) {
    gPiInUse[local_1c] = 1;
    if (((in_RDI == (char *)0x0) || (sVar3 = strlen(in_RDI), sVar3 == 0)) &&
       (pcVar4 = getenv("PIGPIO_ADDR"), pcVar4 != (char *)0x0)) {
      strlen(pcVar4);
    }
    if (((in_RSI == (char *)0x0) || (sVar3 = strlen(in_RSI), sVar3 == 0)) &&
       (pcVar4 = getenv("PIGPIO_PORT"), pcVar4 != (char *)0x0)) {
      strlen(pcVar4);
    }
    pthread_mutex_init((pthread_mutex_t *)(gCmdMutex + local_1c),(pthread_mutexattr_t *)0x0);
    iVar1 = pigpioOpenSocket(in_stack_00000028,in_stack_00000020);
    gPigCommand[local_1c] = iVar1;
    if (gPigCommand[local_1c] < 0) {
      local_4 = gPigCommand[local_1c];
    }
    else {
      iVar1 = pigpioOpenSocket(in_stack_00000028,in_stack_00000020);
      gPigNotify[local_1c] = iVar1;
      if (gPigNotify[local_1c] < 0) {
        local_4 = gPigNotify[local_1c];
      }
      else {
        iVar1 = pigpio_notify(in_stack_ffffffffffffffe0);
        gPigHandle[local_1c] = iVar1;
        if (gPigHandle[local_1c] < 0) {
          local_4 = -0x7d5;
        }
        else {
          uVar2 = read_bank_1(0);
          gLastLevel[local_1c] = uVar2;
          piVar5 = (int *)malloc(4);
          *piVar5 = local_1c;
          ppVar6 = start_thread((gpioThreadFunc_t *)addrStr,portStr);
          gPthNotify[local_1c] = ppVar6;
          if (gPthNotify[local_1c] == (pthread_t *)0x0) {
            local_4 = -0x7d9;
          }
          else {
            local_4 = local_1c;
          }
        }
      }
    }
  }
  else {
    local_4 = -0x7dc;
  }
  return local_4;
}

Assistant:

int pigpio_start(char *addrStr, char *portStr)
{
   int pi;
   int *userdata;

   for (pi=0; pi<MAX_PI; pi++)
   {
      if (!gPiInUse[pi]) break;
   }

   if (pi >= MAX_PI) return pigif_too_many_pis;

   gPiInUse[pi] = 1;

   if ((!addrStr)  || (!strlen(addrStr)))
   {
      addrStr = getenv(PI_ENVADDR);

      if ((!addrStr) || (!strlen(addrStr)))
      {
         addrStr = PI_DEFAULT_SOCKET_ADDR_STR;
      }
   }

   if ((!portStr) || (!strlen(portStr)))
   {
      portStr = getenv(PI_ENVPORT);

      if ((!portStr) || (!strlen(portStr)))
      {
         portStr = PI_DEFAULT_SOCKET_PORT_STR;
      }
   }

   pthread_mutex_init(&gCmdMutex[pi], NULL);

   gPigCommand[pi] = pigpioOpenSocket(addrStr, portStr);

   if (gPigCommand[pi] >= 0)
   {
      gPigNotify[pi] = pigpioOpenSocket(addrStr, portStr);

      if (gPigNotify[pi] >= 0)
      {
         gPigHandle[pi] = pigpio_notify(pi);

         if (gPigHandle[pi] < 0) return pigif_bad_noib;
         else
         {
            gLastLevel[pi] = read_bank_1(pi);

            /* must be freed by pthNotifyThread */
            userdata = malloc(sizeof(*userdata));
            *userdata = pi;

            gPthNotify[pi] = start_thread(pthNotifyThread, userdata);

            if (gPthNotify[pi]) return pi;
            else                return pigif_notify_failed;

         }
      }
      else return gPigNotify[pi];
   }
   else return gPigCommand[pi];
}